

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O3

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridGlobal>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridGlobal> *this,AccelerationContext *acc,istream *is)

{
  void *pvVar1;
  long lVar2;
  GridGlobal *this_00;
  TypeOneDRule TVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result_1;
  pointer pvVar8;
  pointer pdVar9;
  int *piVar10;
  int *piVar11;
  pointer *__ptr;
  int iVar12;
  MultiIndexSet *work;
  int v;
  undefined1 local_108 [8];
  pointer piStack_100;
  vector<double,_std::allocator<double>_> vStack_f8;
  undefined1 auStack_e0 [24];
  undefined1 auStack_c8 [24];
  undefined1 auStack_b0 [16];
  _Alloc_hider local_a0;
  undefined1 local_98 [8];
  undefined1 local_90 [40];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  AccelerationContext *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_50 = acc;
  Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_50);
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  *(undefined4 *)(*(long *)this + 0x10) = local_108._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  *(undefined4 *)(*(long *)this + 0x14) = local_108._0_4_;
  ::std::istream::_M_extract<double>((double *)is);
  *(undefined1 (*) [8])(*(long *)this + 0x98) = local_108;
  ::std::istream::_M_extract<double>((double *)is);
  *(undefined1 (*) [8])(*(long *)this + 0xa0) = local_108;
  TVar3 = IO::readRule<TasGrid::IO::mode_ascii_type>(is);
  pvVar8 = *(pointer *)this;
  *(TypeOneDRule *)
   &pvVar8[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = TVar3;
  if (TVar3 == rule_customtabulated) {
    CustomTabulated::CustomTabulated<TasGrid::IO::mode_ascii_type>((CustomTabulated *)local_108,is);
    lVar5 = *(long *)this;
    *(undefined4 *)(lVar5 + 0x260) = local_108._0_4_;
    pvVar1 = *(void **)(lVar5 + 0x268);
    lVar2 = *(long *)(lVar5 + 0x278);
    *(pointer *)(lVar5 + 0x268) = piStack_100;
    *(pointer *)(lVar5 + 0x270) =
         vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)(lVar5 + 0x278) =
         vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piStack_100 = (pointer)0x0;
    vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,lVar2 - (long)pvVar1);
    }
    pvVar1 = *(void **)(lVar5 + 0x280);
    lVar2 = *(long *)(lVar5 + 0x290);
    *(pointer *)(lVar5 + 0x280) =
         vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)(lVar5 + 0x288) = auStack_e0._0_8_;
    *(undefined8 *)(lVar5 + 0x290) = auStack_e0._8_8_;
    vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    auStack_e0._0_8_ = (pointer)0x0;
    auStack_e0._8_8_ = (pointer)0x0;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,lVar2 - (long)pvVar1);
    }
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar5 + 0x2a8);
    *(undefined8 *)(lVar5 + 0x2a8) = auStack_c8._8_8_;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar5 + 0x298);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar5 + 0x2a0);
    *(undefined8 *)(lVar5 + 0x298) = auStack_e0._16_8_;
    *(undefined8 *)(lVar5 + 0x2a0) = auStack_c8._0_8_;
    auStack_e0._16_8_ = (pointer)0x0;
    auStack_c8._0_8_ = (pointer)0x0;
    auStack_c8._8_8_ = (pointer)0x0;
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_48);
    pvVar8 = (pointer)auStack_b0._8_8_;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar5 + 0x2c0);
    *(undefined8 *)(lVar5 + 0x2c0) = auStack_b0._8_8_;
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar5 + 0x2b0);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar5 + 0x2b8);
    *(undefined8 *)(lVar5 + 0x2b0) = auStack_c8._16_8_;
    *(undefined8 *)(lVar5 + 0x2b8) = auStack_b0._0_8_;
    auStack_c8._16_8_ = (pointer)0x0;
    auStack_b0._0_8_ = (pointer)0x0;
    auStack_b0._8_8_ = (pointer)0x0;
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_48);
    ::std::__cxx11::string::operator=((string *)(lVar5 + 0x2c8),(string *)&local_a0);
    if ((pointer)local_a0._M_p != (pointer)local_90) {
      operator_delete(local_a0._M_p,(ulong)(local_90._0_8_ + 1));
    }
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(auStack_c8 + 0x10));
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(auStack_e0 + 0x10));
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      auStack_e0._8_8_ -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (piStack_100 != (pointer)0x0) {
      operator_delete(piStack_100,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piStack_100);
    }
  }
  iVar6 = (int)pvVar8;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
  lVar5 = *(long *)this;
  *(TypeOneDRule *)(lVar5 + 0x168) = (TypeOneDRule)piStack_100;
  *(undefined1 (*) [8])(lVar5 + 0x160) = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x170),
             (vector<int,_std::allocator<int>_> *)&vStack_f8);
  if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
  lVar5 = *(long *)this;
  *(TypeOneDRule *)(lVar5 + 400) = (TypeOneDRule)piStack_100;
  *(undefined1 (*) [8])(lVar5 + 0x188) = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x198),
             (vector<int,_std::allocator<int>_> *)&vStack_f8);
  if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 400),iVar6);
  pdVar9 = vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = *(long *)this;
  pvVar1 = *(void **)(lVar5 + 0x1b0);
  lVar2 = *(long *)(lVar5 + 0x1c0);
  *(undefined1 (*) [8])(lVar5 + 0x1b0) = local_108;
  *(pointer *)(lVar5 + 0x1b8) = piStack_100;
  *(pointer *)(lVar5 + 0x1c0) =
       vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_108 = (undefined1  [8])0x0;
  piStack_100 = (pointer)0x0;
  vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,lVar2 - (long)pvVar1);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_108);
    }
  }
  iVar6 = (int)pdVar9;
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar5 = *(long *)this;
    *(TypeOneDRule *)(lVar5 + 0x20) = (TypeOneDRule)piStack_100;
    *(undefined1 (*) [8])(lVar5 + 0x18) = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x28),
               (vector<int,_std::allocator<int>_> *)&vStack_f8);
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar5 = *(long *)this;
    *(TypeOneDRule *)(lVar5 + 0x48) = (TypeOneDRule)piStack_100;
    *(undefined1 (*) [8])(lVar5 + 0x40) = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x50),
               (vector<int,_std::allocator<int>_> *)&vStack_f8);
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 0x10),iVar6);
  lVar5 = *(long *)this;
  pvVar1 = *(void **)(lVar5 + 0x1e0);
  lVar2 = *(long *)(lVar5 + 0x1f0);
  *(undefined1 (*) [8])(lVar5 + 0x1e0) = local_108;
  *(pointer *)(lVar5 + 0x1e8) = piStack_100;
  *(pointer *)(lVar5 + 0x1f0) =
       vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_108 = (undefined1  [8])0x0;
  piStack_100 = (pointer)0x0;
  vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,lVar2 - (long)pvVar1);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_108);
    }
  }
  if (0 < *(int *)(*(long *)this + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)local_108,is);
    lVar5 = *(long *)this;
    *(undefined1 (*) [8])(lVar5 + 0x68) = local_108;
    *(pointer *)(lVar5 + 0x70) = piStack_100;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x78),&vStack_f8);
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ == 0) {
    lVar5 = *(long *)this;
    piVar4 = *(int **)(lVar5 + 0x1e0);
    piVar10 = *(int **)(lVar5 + 0x1e8);
    piVar11 = piVar4 + 1;
    if (piVar11 != piVar10 && piVar4 != piVar10) {
      iVar6 = *piVar4;
      do {
        iVar7 = *piVar11;
        iVar12 = iVar6;
        if (iVar6 <= iVar7) {
          iVar12 = iVar7;
        }
        if (iVar6 < iVar7) {
          piVar4 = piVar11;
        }
        piVar11 = piVar11 + 1;
        iVar6 = iVar12;
      } while (piVar11 != piVar10);
    }
    iVar6 = *piVar4;
  }
  else {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar5 = *(long *)this;
    *(TypeOneDRule *)(lVar5 + 0x200) = (TypeOneDRule)piStack_100;
    *(undefined1 (*) [8])(lVar5 + 0x1f8) = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x208),
               (vector<int,_std::allocator<int>_> *)&vStack_f8);
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar4 = *(int **)(*(long *)this + 0x208);
    piVar10 = *(int **)(*(long *)this + 0x210);
    if (piVar4 == piVar10) {
      iVar6 = 0;
    }
    else {
      piVar11 = piVar4 + 1;
      if (piVar11 != piVar10) {
        iVar6 = *piVar4;
        do {
          iVar7 = *piVar11;
          iVar12 = iVar6;
          if (iVar6 <= iVar7) {
            iVar12 = iVar7;
          }
          if (iVar6 < iVar7) {
            piVar4 = piVar11;
          }
          piVar11 = piVar11 + 1;
          iVar6 = iVar12;
        } while (piVar11 != piVar10);
      }
      iVar6 = *piVar4;
    }
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    iVar7 = (int)piVar10;
    lVar5 = *(long *)this;
    *(TypeOneDRule *)(lVar5 + 0x228) = (TypeOneDRule)piStack_100;
    *(undefined1 (*) [8])(lVar5 + 0x220) = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar5 + 0x230),
               (vector<int,_std::allocator<int>_> *)&vStack_f8);
    if (vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x228),iVar7);
    lVar5 = *(long *)this;
    pvVar1 = *(void **)(lVar5 + 0x248);
    lVar2 = *(long *)(lVar5 + 600);
    *(undefined1 (*) [8])(lVar5 + 0x248) = local_108;
    *(pointer *)(lVar5 + 0x250) = piStack_100;
    *(pointer *)(lVar5 + 600) =
         vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_108 = (undefined1  [8])0x0;
    piStack_100 = (pointer)0x0;
    vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,lVar2 - (long)pvVar1);
      if (local_108 != (undefined1  [8])0x0) {
        operator_delete((void *)local_108,
                        (long)vStack_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_108);
      }
    }
    lVar5 = *(long *)this;
  }
  OneDimensionalWrapper::OneDimensionalWrapper
            ((OneDimensionalWrapper *)local_108,(CustomTabulated *)(lVar5 + 0x260),iVar6,
             *(TypeOneDRule *)(lVar5 + 0x90),*(double *)(lVar5 + 0x98),*(double *)(lVar5 + 0xa0));
  lVar5 = *(long *)this;
  *(TypeOneDRule *)(lVar5 + 0xb0) = (TypeOneDRule)piStack_100;
  *(undefined1 (*) [8])(lVar5 + 0xa8) = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar5 + 0xb8),
             (vector<int,_std::allocator<int>_> *)&vStack_f8);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar5 + 0xd0),
             (vector<int,_std::allocator<int>_> *)auStack_e0);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar5 + 0xe8),
             (vector<int,_std::allocator<int>_> *)auStack_c8);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar5 + 0x100),
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)auStack_b0);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar5 + 0x118),
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_98);
  ::std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x130),
             (vector<double,_std::allocator<double>_> *)(local_90 + 0x10));
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar5 + 0x148),&local_68);
  OneDimensionalWrapper::~OneDimensionalWrapper((OneDimensionalWrapper *)local_108);
  this_00 = *(GridGlobal **)this;
  work = &(this_00->super_BaseCanonicalGrid).points;
  if ((this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
      (this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    work = &(this_00->super_BaseCanonicalGrid).needed;
  }
  GridGlobal::recomputeTensorRefs(this_00,work);
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

static std::unique_ptr<GridGlobal> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridGlobal> grid = Utils::make_unique<GridGlobal>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->alpha = IO::readNumber<iomode, double>(is);
        grid->beta = IO::readNumber<iomode, double>(is);
        grid->rule = IO::readRule<iomode>(is);
        if (grid->rule == rule_customtabulated) grid->custom = CustomTabulated(is, iomode());
        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(grid->custom, oned_max_level, grid->rule, grid->alpha, grid->beta);

        grid->recomputeTensorRefs((grid->points.empty()) ? grid->needed : grid->points);

        return grid;
    }